

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderStateQueryTests.cpp
# Opt level: O2

void deqp::gles2::Functional::anon_unknown_0::verifyUniformValue4i
               (TestContext *testCtx,CallLogWrapper *gl,GLuint program,GLint location,GLint x,
               GLint y,GLint z,GLint w)

{
  ostringstream *this;
  bool bVar1;
  int iVar2;
  undefined1 auVar3 [16];
  StateQueryMemoryWriteGuard<int[4]> state;
  MessageBuilder local_1b0;
  
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int[4]>::StateQueryMemoryWriteGuard(&state);
  glu::CallLogWrapper::glGetUniformiv(gl,program,location,state.m_value);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int[4]>::verifyValidity
                    (&state,testCtx);
  if (bVar1) {
    auVar3._0_4_ = -(uint)(state.m_value[0] == 1);
    auVar3._4_4_ = -(uint)(x == state.m_value[1]);
    auVar3._8_4_ = -(uint)(y == state.m_value[2]);
    auVar3._12_4_ = -(uint)(z == state.m_value[3]);
    iVar2 = movmskps(1,auVar3);
    if (iVar2 != 0xf) {
      local_1b0.m_log = testCtx->m_log;
      this = &local_1b0.m_str;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
      std::operator<<((ostream *)this,"// ERROR: expected [");
      std::ostream::operator<<(this,1);
      std::operator<<((ostream *)this,", ");
      std::ostream::operator<<(this,x);
      std::operator<<((ostream *)this,", ");
      std::ostream::operator<<(this,y);
      std::operator<<((ostream *)this,", ");
      std::ostream::operator<<(this,z);
      std::operator<<((ostream *)this,"]; got [");
      std::ostream::operator<<(this,state.m_value[0]);
      std::operator<<((ostream *)this,", ");
      std::ostream::operator<<(this,state.m_value[1]);
      std::operator<<((ostream *)this,", ");
      std::ostream::operator<<(this,state.m_value[2]);
      std::operator<<((ostream *)this,", ");
      std::ostream::operator<<(this,state.m_value[3]);
      std::operator<<((ostream *)this,"]");
      tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
      if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
        tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid uniform value");
      }
    }
  }
  return;
}

Assistant:

void verifyUniformValue4i (tcu::TestContext& testCtx, glu::CallLogWrapper& gl, GLuint program, GLint location, GLint x, GLint y, GLint z, GLint w)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLint[4]> state;
	gl.glGetUniformiv(program, location, state);

	if (!state.verifyValidity(testCtx))
		return;

	if (state[0] != x ||
		state[1] != y ||
		state[2] != z ||
		state[3] != w)
	{
		testCtx.getLog() << TestLog::Message
		<< "// ERROR: expected ["
		<< x << ", "
		<< y << ", "
		<< z << ", "
		<< w
		<< "]; got ["
		<< state[0] << ", "
		<< state[1] << ", "
		<< state[2] << ", "
		<< state[3]
		<< "]"
		<< TestLog::EndMessage;

		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid uniform value");
	}
}